

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void dropCell(MemPage *pPage,int idx,int sz,int *pRC)

{
  ulong uVar1;
  u8 uVar2;
  u8 uVar3;
  byte bVar4;
  u8 uVar5;
  u8 uVar6;
  u8 *puVar7;
  u8 *puVar8;
  int iVar9;
  u8 *puVar10;
  byte bVar11;
  ulong uVar12;
  uchar *data;
  ushort uVar13;
  ushort uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ushort uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  
  if (*pRC != 0) {
    return;
  }
  puVar7 = pPage->aData;
  puVar10 = pPage->aCellIdx;
  lVar21 = (long)idx;
  uVar2 = puVar10[lVar21 * 2];
  uVar3 = puVar10[lVar21 * 2 + 1];
  uVar13 = CONCAT11(uVar2,uVar3);
  bVar4 = pPage->hdrOffset;
  if ((uint)(ushort)(*(ushort *)(puVar7 + (ulong)bVar4 + 5) << 8 |
                    *(ushort *)(puVar7 + (ulong)bVar4 + 5) >> 8) <= (uint)uVar13) {
    uVar20 = pPage->pBt->usableSize;
    if ((uint)uVar13 + sz <= uVar20) {
      bVar11 = bVar4;
      if ((pPage->pBt->btsFlags & 4) != 0) {
        memset(puVar7 + uVar13,0,(long)sz);
        bVar11 = pPage->hdrOffset;
        uVar20 = pPage->pBt->usableSize;
      }
      puVar10 = puVar10 + lVar21 * 2;
      uVar12 = (ulong)bVar11;
      uVar1 = uVar12 + 1;
      uVar17 = uVar1;
      do {
        uVar5 = puVar7[uVar17];
        uVar6 = puVar7[uVar17 + 1];
        uVar19 = (uint)CONCAT11(uVar5,uVar6);
        if ((uVar13 <= uVar19) || (uVar19 == 0)) {
          iVar9 = 0xc6b2;
          if ((int)uVar19 <= (int)(uVar20 - 4)) {
            puVar7[uVar17] = uVar2;
            puVar7[uVar17 + 1] = uVar3;
            puVar7[uVar13] = uVar5;
            puVar7[(ulong)uVar13 + 1] = uVar6;
            puVar7[(ulong)uVar13 + 2] = (u8)((uint)sz >> 8);
            puVar7[(ulong)uVar13 + 3] = (u8)sz;
            pPage->nFree = pPage->nFree + (short)sz;
            uVar17 = uVar1;
            while( true ) {
              do {
                uVar16 = uVar17;
                uVar13 = *(ushort *)(puVar7 + uVar16) << 8 | *(ushort *)(puVar7 + uVar16) >> 8;
                if (uVar13 == 0) {
                  if (puVar7[uVar1] == puVar7[uVar12 + 5]) {
                    bVar11 = puVar7[uVar12 + 2];
                    if (bVar11 == puVar7[uVar12 + 6]) {
                      lVar15 = (ulong)puVar7[uVar1] * 0x100;
                      lVar21 = lVar15 + (ulong)bVar11;
                      *(undefined2 *)(puVar7 + uVar1) = *(undefined2 *)(puVar7 + lVar21);
                      uVar13 = CONCAT11(puVar7[lVar21 + 2],puVar7[lVar21 + 3]) +
                               ((ushort)bVar11 | (ushort)lVar15);
                      *(ushort *)(puVar7 + uVar12 + 5) = uVar13 * 0x100 | uVar13 >> 8;
                    }
                  }
                  puVar8 = pPage->aCellIdx;
                  uVar13 = pPage->nCell;
                  for (; puVar10 < puVar8 + (ulong)uVar13 * 2 + -2; puVar10 = puVar10 + 2) {
                    *(undefined2 *)puVar10 = *(undefined2 *)(puVar10 + 2);
                  }
                  iVar9 = *(int *)&pPage->nCell + -1;
                  pPage->nCell = (u16)iVar9;
                  puVar7[(ulong)bVar4 + 3] = (u8)((uint)iVar9 >> 8);
                  puVar7[(ulong)bVar4 + 4] = (u8)pPage->nCell;
                  pPage->nFree = pPage->nFree + 2;
                  return;
                }
                uVar17 = (ulong)uVar13;
                uVar14 = *(ushort *)(puVar7 + uVar17) << 8 | *(ushort *)(puVar7 + uVar17) >> 8;
                uVar18 = *(ushort *)(puVar7 + uVar17 + 2) << 8 |
                         *(ushort *)(puVar7 + uVar17 + 2) >> 8;
              } while ((uint)uVar18 + (uint)uVar13 + 3 <= uVar14 - 1);
              uVar20 = (uint)uVar14 - ((uint)uVar18 + (uint)uVar13);
              iVar9 = 0xc6c5;
              if (((int)uVar20 < 0) || (puVar7[uVar12 + 7] < uVar20)) break;
              puVar7[uVar12 + 7] = puVar7[uVar12 + 7] - (char)uVar20;
              *(undefined2 *)(puVar7 + uVar17) = *(undefined2 *)(puVar7 + uVar14);
              uVar13 = (uVar14 - uVar13) +
                       CONCAT11(puVar7[(ulong)uVar14 + 2],puVar7[(ulong)uVar14 + 3]);
              *(ushort *)(puVar7 + uVar17 + 2) = uVar13 * 0x100 | uVar13 >> 8;
              uVar17 = uVar16;
            }
          }
          goto LAB_00156f96;
        }
        iVar9 = (int)uVar17;
        uVar17 = (ulong)uVar19;
      } while (iVar9 + 4U <= uVar19);
      iVar9 = 0xc6ad;
      goto LAB_00156f96;
    }
  }
  iVar9 = 0xd79b;
LAB_00156f96:
  sqlite3CorruptError(iVar9);
  *pRC = 0xb;
  return;
}

Assistant:

static void dropCell(MemPage *pPage, int idx, int sz, int *pRC){
  u32 pc;         /* Offset to cell content of cell being deleted */
  u8 *data;       /* pPage->aData */
  u8 *ptr;        /* Used to move bytes around within data[] */
  u8 *endPtr;     /* End of loop */
  int rc;         /* The return code */
  int hdr;        /* Beginning of the header.  0 most pages.  100 page 1 */

  if( *pRC ) return;

  assert( idx>=0 && idx<pPage->nCell );
  assert( sz==cellSize(pPage, idx) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  ptr = &pPage->aCellIdx[2*idx];
  pc = get2byte(ptr);
  hdr = pPage->hdrOffset;
  testcase( pc==get2byte(&data[hdr+5]) );
  testcase( pc+sz==pPage->pBt->usableSize );
  if( pc < (u32)get2byte(&data[hdr+5]) || pc+sz > pPage->pBt->usableSize ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  rc = freeSpace(pPage, pc, sz);
  if( rc ){
    *pRC = rc;
    return;
  }
  endPtr = &pPage->aCellIdx[2*pPage->nCell - 2];
  assert( (SQLITE_PTR_TO_INT(ptr)&1)==0 );  /* ptr is always 2-byte aligned */
  while( ptr<endPtr ){
    *(u16*)ptr = *(u16*)&ptr[2];
    ptr += 2;
  }
  pPage->nCell--;
  put2byte(&data[hdr+3], pPage->nCell);
  pPage->nFree += 2;
}